

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegExecGetValues(xmlRegExecCtxtPtr exec,int err,int *nbval,int *nbneg,xmlChar **values,
                       int *terminal)

{
  int iVar1;
  xmlRegexpPtr pxVar2;
  xmlRegTrans *pxVar3;
  long lVar4;
  xmlRegStatePtr pxVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  xmlRegStatePtr pxVar11;
  long lVar12;
  int iVar13;
  xmlChar *pxVar14;
  long lVar15;
  xmlRegCounter *pxVar16;
  long lVar17;
  long lVar18;
  
  iVar6 = -1;
  if (((values != (xmlChar **)0x0 && nbneg != (int *)0x0) &&
       (nbval != (int *)0x0 && exec != (xmlRegExecCtxtPtr)0x0)) && (iVar1 = *nbval, 0 < iVar1)) {
    *nbval = 0;
    *nbneg = 0;
    pxVar2 = exec->comp;
    if ((pxVar2 == (xmlRegexpPtr)0x0) || (pxVar2->compact == (int *)0x0)) {
      if (terminal != (int *)0x0) {
        *terminal = (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
      }
      if (err == 0) {
        pxVar11 = exec->state;
      }
      else {
        pxVar11 = exec->errState;
      }
      iVar6 = -1;
      if (pxVar11 != (xmlRegStatePtr)0x0) {
        iVar6 = 0;
        iVar13 = 0;
        if (0 < pxVar11->nbTrans) {
          lVar12 = 0x88;
          if (err == 0) {
            lVar12 = 0x40;
          }
          iVar13 = 0;
          lVar18 = 0x10;
          lVar17 = 1;
          do {
            pxVar3 = pxVar11->trans;
            lVar15 = (long)*(int *)((long)pxVar3 + lVar18 + -8);
            if ((((-1 < lVar15) && (lVar4 = *(long *)((long)pxVar3 + lVar18 + -0x10), lVar4 != 0))
                && (pxVar14 = *(xmlChar **)(lVar4 + 0x18), pxVar14 != (xmlChar *)0x0)) &&
               ((*(uint *)((long)&pxVar3->atom + lVar18) & 0xfffffffe) != 0x123456)) {
              lVar9 = (long)*(int *)((long)pxVar3 + lVar18 + -4);
              if (lVar9 < 0) {
                if (((exec->comp != (xmlRegexpPtr)0x0) &&
                    (pxVar5 = exec->comp->states[lVar15], pxVar5 != (xmlRegStatePtr)0x0)) &&
                   (pxVar5->type != XML_REGEXP_SINK_STATE)) goto LAB_0017bc40;
              }
              else {
                if (exec->comp == (xmlRegexpPtr)0x0) {
                  pxVar16 = (xmlRegCounter *)0x0;
                }
                else {
                  pxVar16 = exec->comp->counters + lVar9;
                }
                if ((pxVar16 == (xmlRegCounter *)0x0) ||
                   (*(int *)(*(long *)((long)&exec->status + lVar12) + lVar9 * 4) < pxVar16->max)) {
LAB_0017bc40:
                  if (*(int *)(lVar4 + 0x28) != 0) {
                    pxVar14 = *(xmlChar **)(lVar4 + 0x20);
                  }
                  values[iVar13] = pxVar14;
                  iVar13 = iVar13 + 1;
                  *nbval = *nbval + 1;
                }
              }
            }
            if (pxVar11->nbTrans <= lVar17) break;
            lVar18 = lVar18 + 0x18;
            lVar17 = lVar17 + 1;
          } while (iVar13 < iVar1);
        }
        if (iVar13 < iVar1 && 0 < pxVar11->nbTrans) {
          lVar12 = 0x10;
          lVar18 = 1;
          do {
            pxVar3 = pxVar11->trans;
            lVar17 = (long)*(int *)((long)pxVar3 + lVar12 + -8);
            if (((((-1 < lVar17) && (lVar15 = *(long *)((long)pxVar3 + lVar12 + -0x10), lVar15 != 0)
                  ) && (pxVar14 = *(xmlChar **)(lVar15 + 0x18), pxVar14 != (xmlChar *)0x0)) &&
                (((*(uint *)((long)&pxVar3->atom + lVar12) & 0xfffffffe) != 0x123456 &&
                 (*(int *)((long)pxVar3 + lVar12 + -4) < 0)))) &&
               ((pxVar5 = exec->comp->states[lVar17], pxVar5 != (xmlRegStatePtr)0x0 &&
                (pxVar5->type == XML_REGEXP_SINK_STATE)))) {
              if (*(int *)(lVar15 + 0x28) != 0) {
                pxVar14 = *(xmlChar **)(lVar15 + 0x20);
              }
              values[iVar13] = pxVar14;
              iVar13 = iVar13 + 1;
              *nbneg = *nbneg + 1;
            }
            if (pxVar11->nbTrans <= lVar18) {
              return 0;
            }
            lVar12 = lVar12 + 0x18;
            lVar18 = lVar18 + 1;
          } while (iVar13 < iVar1);
        }
      }
    }
    else {
      if (err == 0) {
        iVar13 = exec->index;
      }
      else {
        iVar13 = exec->errStateNo;
        if (iVar13 == -1) {
          return -1;
        }
      }
      if (terminal != (int *)0x0) {
        *terminal = (uint)(pxVar2->compact[(long)iVar13 * ((long)pxVar2->nbstrings + 1)] == 2);
      }
      uVar8 = (ulong)(uint)pxVar2->nbstrings;
      iVar10 = 0;
      if (0 < pxVar2->nbstrings) {
        lVar12 = 0;
        iVar10 = 0;
        do {
          iVar7 = (int)uVar8 + 1;
          iVar6 = pxVar2->compact[iVar7 * iVar13 + lVar12 + 1];
          if (((0 < iVar6) && (iVar6 <= pxVar2->nbstates)) &&
             (pxVar2->compact[(iVar6 + -1) * iVar7] != 4)) {
            lVar18 = (long)iVar10;
            iVar10 = iVar10 + 1;
            values[lVar18] = pxVar2->stringMap[lVar12];
            *nbval = *nbval + 1;
          }
          lVar12 = lVar12 + 1;
          uVar8 = (ulong)pxVar2->nbstrings;
        } while ((lVar12 < (long)uVar8) && (iVar10 < iVar1));
      }
      uVar8 = (ulong)(uint)pxVar2->nbstrings;
      iVar6 = 0;
      if (iVar10 < iVar1 && 0 < pxVar2->nbstrings) {
        lVar12 = 0;
        do {
          iVar7 = (int)uVar8 + 1;
          iVar6 = pxVar2->compact[iVar7 * iVar13 + lVar12 + 1];
          if (((0 < iVar6) && (iVar6 <= pxVar2->nbstates)) &&
             (pxVar2->compact[(iVar6 + -1) * iVar7] == 4)) {
            lVar18 = (long)iVar10;
            iVar10 = iVar10 + 1;
            values[lVar18] = pxVar2->stringMap[lVar12];
            *nbneg = *nbneg + 1;
          }
          lVar12 = lVar12 + 1;
          uVar8 = (ulong)pxVar2->nbstrings;
          iVar6 = 0;
        } while ((lVar12 < (long)uVar8) && (iVar6 = 0, iVar10 < iVar1));
      }
    }
  }
  return iVar6;
}

Assistant:

static int
xmlRegExecGetValues(xmlRegExecCtxtPtr exec, int err,
                    int *nbval, int *nbneg,
		    xmlChar **values, int *terminal) {
    int maxval;
    int nb = 0;

    if ((exec == NULL) || (nbval == NULL) || (nbneg == NULL) ||
        (values == NULL) || (*nbval <= 0))
        return(-1);

    maxval = *nbval;
    *nbval = 0;
    *nbneg = 0;
    if ((exec->comp != NULL) && (exec->comp->compact != NULL)) {
        xmlRegexpPtr comp;
	int target, i, state;

        comp = exec->comp;

	if (err) {
	    if (exec->errStateNo == -1) return(-1);
	    state = exec->errStateNo;
	} else {
	    state = exec->index;
	}
	if (terminal != NULL) {
	    if (comp->compact[state * (comp->nbstrings + 1)] ==
	        XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] !=
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbval)++;
	    }
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] ==
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbneg)++;
	    }
	}
    } else {
        int transno;
	xmlRegTransPtr trans;
	xmlRegAtomPtr atom;
	xmlRegStatePtr state;

	if (terminal != NULL) {
	    if (exec->state->type == XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}

	if (err) {
	    if (exec->errState == NULL) return(-1);
	    state = exec->errState;
	} else {
	    if (exec->state == NULL) return(-1);
	    state = exec->state;
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        /* this should not be reached but ... */
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        /* this should not be reached but ... */
	    } else if (trans->counter >= 0) {
		xmlRegCounterPtr counter = NULL;
		int count;

		if (err)
		    count = exec->errCounts[trans->counter];
		else
		    count = exec->counts[trans->counter];
		if (exec->comp != NULL)
		    counter = &exec->comp->counters[trans->counter];
		if ((counter == NULL) || (count < counter->max)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    } else {
                if ((exec->comp != NULL) && (exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type !=
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    }
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        continue;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        continue;
	    } else if (trans->counter >= 0) {
	        continue;
	    } else {
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbneg)++;
		}
	    }
	}
    }
    return(0);
}